

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satcheck.c
# Opt level: O0

parasail_result_t *
parasail_sg_qe_de_table_striped_profile_sse41_128_sat
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  undefined8 local_30;
  parasail_result_t *result;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  
  local_30 = parasail_sg_qe_de_table_striped_profile_sse41_128_8(profile,s2,s2Len,open,gap);
  iVar1 = parasail_result_is_saturated(local_30);
  if (iVar1 != 0) {
    parasail_result_free(local_30);
    local_30 = parasail_sg_qe_de_table_striped_profile_sse41_128_16(profile,s2,s2Len,open,gap);
  }
  iVar1 = parasail_result_is_saturated(local_30);
  if (iVar1 != 0) {
    parasail_result_free(local_30);
    local_30 = parasail_sg_qe_de_table_striped_profile_sse41_128_32(profile,s2,s2Len,open,gap);
  }
  return local_30;
}

Assistant:

parasail_result_t* parasail_sg_qe_de_table_striped_profile_sse41_128_sat(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    parasail_result_t * result = NULL;

    result = parasail_sg_qe_de_table_striped_profile_sse41_128_8(profile, s2, s2Len, open, gap);
    if (parasail_result_is_saturated(result)) {
        parasail_result_free(result);
        result = parasail_sg_qe_de_table_striped_profile_sse41_128_16(profile, s2, s2Len, open, gap);
    }
    if (parasail_result_is_saturated(result)) {
        parasail_result_free(result);
        result = parasail_sg_qe_de_table_striped_profile_sse41_128_32(profile, s2, s2Len, open, gap);
    }

    return result;
}